

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O1

void __thiscall
QTouchEvent::QTouchEvent
          (QTouchEvent *this,Type eventType,QPointingDevice *device,KeyboardModifiers modifiers,
          QList<QEventPoint> *touchPoints)

{
  QList<QEventPoint> *this_00;
  State SVar1;
  iterator this_01;
  iterator iVar2;
  QEventPoint *point;
  
  QPointerEvent::QPointerEvent(&this->super_QPointerEvent,eventType,device,modifiers,touchPoints);
  *(undefined ***)&(this->super_QPointerEvent).super_QInputEvent = &PTR__QHoverEvent_007e4758;
  this->m_target = (QObject *)0x0;
  (this->m_touchPointStates).super_QFlagsStorageHelper<QEventPoint::State,_4>.
  super_QFlagsStorage<QEventPoint::State>.i = 0;
  this_00 = &(this->super_QPointerEvent).m_points;
  this_01 = QList<QEventPoint>::begin(this_00);
  iVar2 = QList<QEventPoint>::end(this_00);
  for (; this_01.i != iVar2.i; this_01.i = this_01.i + 1) {
    SVar1 = QEventPoint::state(this_01.i);
    (this->m_touchPointStates).super_QFlagsStorageHelper<QEventPoint::State,_4>.
    super_QFlagsStorage<QEventPoint::State>.i =
         (this->m_touchPointStates).super_QFlagsStorageHelper<QEventPoint::State,_4>.
         super_QFlagsStorage<QEventPoint::State>.i | (uint)SVar1;
    (((this_01.i)->d).d.ptr)->device = device;
  }
  return;
}

Assistant:

QTouchEvent::QTouchEvent(QEvent::Type eventType,
                         const QPointingDevice *device,
                         Qt::KeyboardModifiers modifiers,
                         const QList<QEventPoint> &touchPoints)
    : QPointerEvent(eventType, device, modifiers, touchPoints),
      m_target(nullptr)
{
    for (QEventPoint &point : m_points) {
        m_touchPointStates |= point.state();
        QMutableEventPoint::setDevice(point, device);
    }
}